

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

void __thiscall badlywrapped<spair>::~badlywrapped(badlywrapped<spair> *this)

{
  badlywrapped<spair> *this_local;
  
  spair::~spair(&this->value);
  return;
}

Assistant:

badlywrapped() : value() {}